

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

Token * __thiscall
inja::Lexer::scan_body(Token *__return_storage_ptr__,Lexer *this,string_view close,Kind closeKind)

{
  char cVar1;
  ulong uVar2;
  size_t sVar3;
  string_view prefix;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  const_reference pcVar7;
  basic_string_view<char,_std::char_traits<char>_> view;
  char ch;
  Kind closeKind_local;
  Lexer *this_local;
  string_view close_local;
  
  close_local.data_ = (const_pointer)close.size_;
  this_local = (Lexer *)close.data_;
  while( true ) {
    while( true ) {
      uVar2 = this->m_tok_start;
      sVar6 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::size(&this->m_in);
      if (sVar6 <= uVar2) {
        make_token(__return_storage_ptr__,this,Eof);
        return __return_storage_ptr__;
      }
      pcVar7 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         (&this->m_in,this->m_tok_start);
      cVar1 = *pcVar7;
      if (((cVar1 != ' ') && (cVar1 != '\t')) && (cVar1 != '\r')) break;
      this->m_tok_start = this->m_tok_start + 1;
    }
    view = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                     (&this->m_in,this->m_tok_start,0xffffffffffffffff);
    prefix.size_ = (size_type)close_local.data_;
    prefix.data_ = (const_pointer)this_local;
    bVar4 = string_view::starts_with(view,prefix);
    if (bVar4) break;
    if (cVar1 != '\n') {
      this->m_pos = this->m_tok_start + 1;
      iVar5 = isalpha((int)cVar1);
      if (iVar5 != 0) {
        scan_id(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      }
      switch(cVar1) {
      case '!':
        goto switchD_001c1a4b_caseD_21;
      case '\"':
        scan_string(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      default:
        make_token(__return_storage_ptr__,this,Unknown);
        return __return_storage_ptr__;
      case '(':
        make_token(__return_storage_ptr__,this,LeftParen);
        return __return_storage_ptr__;
      case ')':
        make_token(__return_storage_ptr__,this,RightParen);
        return __return_storage_ptr__;
      case ',':
        make_token(__return_storage_ptr__,this,Comma);
        return __return_storage_ptr__;
      case '-':
      case '0':
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
        scan_number(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      case ':':
        make_token(__return_storage_ptr__,this,Colon);
        return __return_storage_ptr__;
      case '<':
        uVar2 = this->m_pos;
        sVar6 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::size(&this->m_in)
        ;
        if ((uVar2 < sVar6) &&
           (pcVar7 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::operator[]
                               (&this->m_in,this->m_pos), *pcVar7 == '=')) {
          this->m_pos = this->m_pos + 1;
          make_token(__return_storage_ptr__,this,LessEqual);
          return __return_storage_ptr__;
        }
        make_token(__return_storage_ptr__,this,LessThan);
        return __return_storage_ptr__;
      case '=':
        uVar2 = this->m_pos;
        sVar6 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::size(&this->m_in)
        ;
        if ((uVar2 < sVar6) &&
           (pcVar7 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::operator[]
                               (&this->m_in,this->m_pos), *pcVar7 == '=')) {
          this->m_pos = this->m_pos + 1;
          make_token(__return_storage_ptr__,this,Equal);
          return __return_storage_ptr__;
        }
        make_token(__return_storage_ptr__,this,Unknown);
        return __return_storage_ptr__;
      case '>':
        uVar2 = this->m_pos;
        sVar6 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::size(&this->m_in)
        ;
        if ((uVar2 < sVar6) &&
           (pcVar7 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::operator[]
                               (&this->m_in,this->m_pos), *pcVar7 == '=')) {
          this->m_pos = this->m_pos + 1;
          make_token(__return_storage_ptr__,this,GreaterEqual);
          return __return_storage_ptr__;
        }
        make_token(__return_storage_ptr__,this,GreaterThan);
        return __return_storage_ptr__;
      case '[':
        make_token(__return_storage_ptr__,this,LeftBracket);
        return __return_storage_ptr__;
      case ']':
        make_token(__return_storage_ptr__,this,RightBracket);
        return __return_storage_ptr__;
      case '_':
        scan_id(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      case '{':
        make_token(__return_storage_ptr__,this,LeftBrace);
        return __return_storage_ptr__;
      case '}':
        make_token(__return_storage_ptr__,this,RightBrace);
        return __return_storage_ptr__;
      }
    }
    this->m_tok_start = this->m_tok_start + 1;
  }
  this->m_state = Text;
  sVar3 = this->m_tok_start;
  sVar6 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  this->m_pos = sVar3 + sVar6;
  make_token(__return_storage_ptr__,this,closeKind);
  return __return_storage_ptr__;
switchD_001c1a4b_caseD_21:
  uVar2 = this->m_pos;
  sVar6 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::size(&this->m_in);
  if ((uVar2 < sVar6) &&
     (pcVar7 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         (&this->m_in,this->m_pos), *pcVar7 == '=')) {
    this->m_pos = this->m_pos + 1;
    make_token(__return_storage_ptr__,this,NotEqual);
    return __return_storage_ptr__;
  }
  make_token(__return_storage_ptr__,this,Unknown);
  return __return_storage_ptr__;
}

Assistant:

Token scan_body(nonstd::string_view close, Token::Kind closeKind) {
	again:
		// skip whitespace (except for \n as it might be a close)
		if (m_tok_start >= m_in.size()) return make_token(Token::Kind::Eof);
		char ch = m_in[m_tok_start];
		if (ch == ' ' || ch == '\t' || ch == '\r') {
			m_tok_start += 1;
			goto again;
		}

		// check for close
		if (inja::string_view::starts_with(m_in.substr(m_tok_start), close)) {
			m_state = State::Text;
			m_pos = m_tok_start + close.size();
			return make_token(closeKind);
		}

		// skip \n
		if (ch == '\n') {
			m_tok_start += 1;
			goto again;
		}

		m_pos = m_tok_start + 1;
		if (std::isalpha(ch)) return scan_id();
		switch (ch) {
			case ',':
				return make_token(Token::Kind::Comma);
			case ':':
				return make_token(Token::Kind::Colon);
			case '(':
				return make_token(Token::Kind::LeftParen);
			case ')':
				return make_token(Token::Kind::RightParen);
			case '[':
				return make_token(Token::Kind::LeftBracket);
			case ']':
				return make_token(Token::Kind::RightBracket);
			case '{':
				return make_token(Token::Kind::LeftBrace);
			case '}':
				return make_token(Token::Kind::RightBrace);
			case '>':
				if (m_pos < m_in.size() && m_in[m_pos] == '=') {
					m_pos += 1;
					return make_token(Token::Kind::GreaterEqual);
				}
				return make_token(Token::Kind::GreaterThan);
			case '<':
				if (m_pos < m_in.size() && m_in[m_pos] == '=') {
					m_pos += 1;
					return make_token(Token::Kind::LessEqual);
				}
				return make_token(Token::Kind::LessThan);
			case '=':
				if (m_pos < m_in.size() && m_in[m_pos] == '=') {
					m_pos += 1;
					return make_token(Token::Kind::Equal);
				}
				return make_token(Token::Kind::Unknown);
			case '!':
				if (m_pos < m_in.size() && m_in[m_pos] == '=') {
					m_pos += 1;
					return make_token(Token::Kind::NotEqual);
				}
				return make_token(Token::Kind::Unknown);
			case '\"':
				return scan_string();
			case '0':
			case '1':
			case '2':
			case '3':
			case '4':
			case '5':
			case '6':
			case '7':
			case '8':
			case '9':
			case '-':
				return scan_number();
			case '_':
				return scan_id();
			default:
				return make_token(Token::Kind::Unknown);
		}
	}